

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_playback(Pager *pPager,int isHot)

{
  i64 *pOffset;
  sqlite3_vfs *psVar1;
  char *pcVar2;
  ulong uVar3;
  u32 uVar4;
  Pgno PVar5;
  i64 iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  sqlite3_file *p;
  char *pcVar11;
  char *zMaster;
  ulong uVar12;
  sqlite3_file *pJrnl;
  char *z;
  int iVar13;
  int res;
  u32 nRec;
  char *local_60;
  Pgno mxPg;
  i64 szJ;
  i64 nMasterJournal;
  int local_3c;
  long local_38;
  
  psVar1 = pPager->pVfs;
  mxPg = 0;
  res = 1;
  iVar7 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&szJ);
  if (iVar7 != 0) {
    uVar8 = 0;
LAB_00120ac5:
    pPager->changeCountDone = pPager->tempFile;
    goto LAB_00120d5c;
  }
  pcVar2 = pPager->pTmpSpace;
  iVar7 = readMasterJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
  if (iVar7 == 0) {
    if (*pcVar2 == '\0') {
      iVar7 = 0;
    }
    else {
      iVar7 = (*psVar1->xAccess)(psVar1,pcVar2,0,&res);
    }
  }
  uVar8 = 0;
  if ((iVar7 == 0) && (res != 0)) {
    pOffset = &pPager->journalOff;
    pPager->journalOff = 0;
    iVar9 = isHot;
    uVar10 = 0;
LAB_00120b5c:
    uVar8 = uVar10;
    iVar7 = readJournalHdr(pPager,isHot,szJ,&nRec,&mxPg);
    PVar5 = mxPg;
    if (iVar7 == 0) {
      uVar12 = (ulong)pPager->sectorSize;
      if (nRec == 0xffffffff) {
        nRec = (u32)((long)(szJ - uVar12) / ((long)pPager->pageSize + 8));
      }
      uVar3 = *pOffset;
      if ((nRec == 0 && isHot == 0) && (pPager->journalHdr + uVar12 == uVar3)) {
        nRec = (u32)((long)(szJ - uVar3) / ((long)pPager->pageSize + 8));
      }
      uVar4 = nRec;
      if (uVar3 == uVar12) {
        iVar7 = pager_truncate(pPager,mxPg);
        if (iVar7 != 0) goto LAB_00120ac5;
        pPager->dbSize = PVar5;
      }
      for (iVar13 = 0; uVar10 = uVar8 + uVar4, -uVar4 != iVar13; iVar13 = iVar13 + -1) {
        if (iVar9 != 0) {
          pager_reset(pPager);
        }
        iVar7 = pager_playback_one_page(pPager,pOffset,(Bitvec *)0x0,1,0);
        if (iVar7 != 0) {
          if (iVar7 != 0x65) {
            if (iVar7 != 0x20a) {
              uVar8 = uVar8 - iVar13;
              goto LAB_00120cea;
            }
            uVar8 = uVar8 - iVar13;
            goto LAB_00120cd5;
          }
          *pOffset = szJ;
          iVar9 = 0;
          uVar10 = uVar8 - iVar13;
          break;
        }
        iVar9 = 0;
      }
      goto LAB_00120b5c;
    }
    if (iVar7 != 0x65) goto LAB_00120ac5;
LAB_00120cd5:
    pPager->changeCountDone = pPager->tempFile;
  }
  else {
LAB_00120cea:
    pPager->changeCountDone = pPager->tempFile;
    if (iVar7 != 0) goto LAB_00120d5c;
  }
  pcVar2 = pPager->pTmpSpace;
  iVar7 = readMasterJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
  if ((iVar7 != 0) ||
     (((byte)(pPager->eState - 4) < 0xfd &&
      (iVar7 = sqlite3PagerSync(pPager,(char *)0x0), iVar7 != 0)))) goto LAB_00120d5c;
  iVar7 = pager_end_transaction(pPager,(uint)(*pcVar2 != '\0'),0);
  if ((iVar7 != 0) || ((iVar7 = 0, *pcVar2 == '\0' || (res == 0)))) goto LAB_00120d5c;
  psVar1 = pPager->pVfs;
  p = (sqlite3_file *)sqlite3MallocZero((long)psVar1->szOsFile * 2);
  iVar7 = 7;
  if (p == (sqlite3_file *)0x0) {
LAB_00120e12:
    pcVar11 = (char *)0x0;
  }
  else {
    iVar9 = psVar1->szOsFile;
    iVar7 = (*psVar1->xOpen)(psVar1,pcVar2,p,0x4001,(int *)0x0);
    if (iVar7 != 0) goto LAB_00120e12;
    iVar7 = (*p->pMethods->xFileSize)(p,&nMasterJournal);
    if (iVar7 == 0) {
      local_38 = (long)psVar1->mxPathname;
      pcVar11 = (char *)sqlite3Malloc(nMasterJournal + local_38 + 2);
      iVar6 = nMasterJournal;
      iVar7 = 7;
      if (pcVar11 == (char *)0x0) goto LAB_00120e12;
      local_60 = pcVar11;
      iVar7 = (*p->pMethods->xRead)(p,pcVar11,(int)nMasterJournal,0);
      pcVar11 = local_60;
      if (iVar7 == 0) {
        pJrnl = (sqlite3_file *)((long)&p->pMethods + (long)iVar9);
        local_38 = local_38 + 1;
        zMaster = local_60 + iVar6 + 1;
        local_60[nMasterJournal] = '\0';
        for (z = local_60; (long)z - (long)local_60 < nMasterJournal; z = z + (ulong)uVar10 + 1) {
          iVar9 = (*psVar1->xAccess)(psVar1,z,0,&local_3c);
          pcVar11 = local_60;
          iVar7 = iVar9;
          if (iVar9 != 0) goto LAB_00120e14;
          if (local_3c != 0) {
            iVar7 = (*psVar1->xOpen)(psVar1,z,pJrnl,0x801,(int *)0x0);
            pcVar11 = local_60;
            if (iVar7 != 0) goto LAB_00120e14;
            iVar7 = readMasterJournal(pJrnl,zMaster,(u32)local_38);
            if (pJrnl->pMethods != (sqlite3_io_methods *)0x0) {
              (*pJrnl->pMethods->xClose)(pJrnl);
              pJrnl->pMethods = (sqlite3_io_methods *)0x0;
            }
            pcVar11 = local_60;
            if ((iVar7 != 0) ||
               ((*zMaster != '\0' &&
                (iVar13 = strcmp(zMaster,pcVar2), pcVar11 = local_60, iVar7 = iVar9, iVar13 == 0))))
            goto LAB_00120e14;
          }
          uVar10 = sqlite3Strlen30(z);
        }
        if (p->pMethods != (sqlite3_io_methods *)0x0) {
          (*p->pMethods->xClose)(p);
          p->pMethods = (sqlite3_io_methods *)0x0;
        }
        iVar7 = (*psVar1->xDelete)(psVar1,pcVar2,0);
        pcVar11 = local_60;
      }
    }
    else {
      pcVar11 = (char *)0x0;
    }
  }
LAB_00120e14:
  sqlite3_free(pcVar11);
  if (p != (sqlite3_file *)0x0) {
    if (p->pMethods != (sqlite3_io_methods *)0x0) {
      (*p->pMethods->xClose)(p);
      p->pMethods = (sqlite3_io_methods *)0x0;
    }
    sqlite3_free(p);
  }
LAB_00120d5c:
  if ((isHot != 0) && (uVar8 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar8,pPager->zJournal);
  }
  setSectorSize(pPager);
  return iVar7;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zMaster = 0;       /* Name of master journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the master journal name from the journal, if it is present.
  ** If a master journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  **  mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zMaster = pPager->pTmpSpace;
  rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zMaster[0] ){
    rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
  }
  zMaster = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or 
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error 
  ** occurs. 
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){ 
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages 
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
    }

    /* Copy original pages out of the journal and back into the 
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  if( pPager->fd->pMethods ){
    sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
  }
#endif

  /* If this playback is happening automatically as a result of an IO or 
  ** malloc error that occurred after the change-counter was updated but 
  ** before the transaction was committed, then the change-counter 
  ** modification may just have been reverted. If this happens in exclusive 
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    zMaster = pPager->pTmpSpace;
    rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zMaster[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zMaster[0] && res ){
    /* If there was a master journal and this routine will return success,
    ** see if it is possible to delete the master journal.
    */
    rc = pager_delmaster(pPager, zMaster);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}